

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void DumpTiling(PtexFaceData *dh)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::operator<<((ostream *)&std::cout,"  tiling: ");
  iVar1 = (*dh->_vptr_PtexFaceData[7])(dh);
  if ((char)iVar1 != '\0') {
    uVar2 = (*dh->_vptr_PtexFaceData[8])(dh);
    poVar3 = std::operator<<((ostream *)&std::cout,"ntiles = ");
    iVar1 = (*dh->_vptr_PtexFaceData[4])(dh);
    uStack_28 = CONCAT26((short)iVar1,(undefined6)uStack_28);
    iVar1 = Ptex::v2_2::Res::ntiles((Res *)((long)&uStack_28 + 6),SUB42(uVar2,0));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,", res = ");
    bVar4 = (byte)(uVar2 & 0xffff);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(char)bVar4);
    poVar3 = std::operator<<(poVar3,' ');
    bVar5 = (byte)((uVar2 & 0xffff) >> 8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(char)bVar5);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1 << (bVar4 & 0x1f));
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1 << (bVar5 & 0x1f));
    std::operator<<(poVar3,")\n");
    return;
  }
  iVar1 = (*dh->_vptr_PtexFaceData[3])(dh);
  if ((char)iVar1 == '\0') {
    pcVar6 = "  (untiled)";
  }
  else {
    pcVar6 = "  (constant)";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void DumpTiling(PtexFaceData* dh)
{
    std::cout << "  tiling: ";
    if (dh->isTiled()) {
        Ptex::Res res = dh->tileRes();
        std::cout << "ntiles = " << dh->res().ntiles(res)
                  << ", res = "
                  << int(res.ulog2) << ' ' << int(res.vlog2)
                  << " (" << res.u() << " x " << res.v() << ")\n";
    }
    else if (dh->isConstant()) {
        std::cout << "  (constant)" << std::endl;
    }
    else {
        std::cout << "  (untiled)" << std::endl;
    }
}